

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::SetSkipRows(CSVReaderOptions *this,int64_t skip_rows)

{
  unsigned_long uVar1;
  InvalidInputException *this_00;
  allocator local_39;
  string local_38;
  
  if (-1 < skip_rows) {
    uVar1 = NumericCastImpl<unsigned_long,_long,_false>::Convert(skip_rows);
    if ((this->dialect_options).skip_rows.set_by_user == false) {
      (this->dialect_options).skip_rows.value = uVar1;
      (this->dialect_options).skip_rows.set_by_user = true;
    }
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "skip_rows option from read_csv scanner, must be equal or higher than 0",&local_39);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetSkipRows(int64_t skip_rows) {
	if (skip_rows < 0) {
		throw InvalidInputException("skip_rows option from read_csv scanner, must be equal or higher than 0");
	}
	dialect_options.skip_rows.Set(NumericCast<idx_t>(skip_rows));
}